

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefSparse.cpp
# Opt level: O1

void __thiscall BeliefSparse::Set(BeliefSparse *this)

{
  BeliefInterface *in_RSI;
  
  Set((BeliefSparse *)(&this->field_0x0 + *(long *)(*(long *)this + -0x48)),in_RSI);
  return;
}

Assistant:

void BeliefSparse::Set(const BeliefInterface &belief)
{
    _m_b.resize(belief.Size(),false);
    _m_b.clear();

    for(unsigned int i=0; i!=belief.Size(); ++i)
    {
        if(belief.Get(i)>0)
            _m_b[i]=belief.Get(i);
    }
#if BeliefSparse_CheckAndAbort
    if(!SanityCheck())
        abort();
#endif
}